

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O3

int __thiscall bhf::ads::RegistryAccess::Export(RegistryAccess *this,string *firstKey,ostream *os)

{
  pointer pRVar1;
  _List_node_base *p_Var2;
  _Node *p_Var3;
  RegistryEntry *value;
  pointer pRVar4;
  initializer_list<bhf::ads::RegistryEntry> __l;
  list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> pendingKeys;
  value_type key;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> local_a0;
  RegistryAccess *local_88;
  _List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> local_80;
  undefined1 local_68 [32];
  _List_node_base *p_Stack_48;
  _List_node_base *local_40;
  _List_node_base *p_Stack_38;
  
  local_88 = this;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Windows Registry Editor Version 5.00",0x24)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  RegistryEntry::Create((RegistryEntry *)local_68,firstKey);
  __l._M_len = 1;
  __l._M_array = (iterator)local_68;
  std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::list
            ((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)&local_80,
             __l,(allocator_type *)&local_a0);
  if ((void *)CONCAT71(local_68._1_7_,local_68[0]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_68._1_7_,local_68[0]));
  }
  if (local_80._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_80) {
    do {
      p_Var2 = local_80._M_impl._M_node.super__List_node_base._M_next;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (local_80._M_impl._M_node.super__List_node_base._M_next + 1));
      local_68._24_8_ = p_Var2[2]._M_prev;
      p_Stack_48 = p_Var2[3]._M_next;
      local_40 = p_Var2[3]._M_prev;
      p_Stack_38 = p_Var2[4]._M_next;
      std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::
      _M_erase((list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)&local_80,
               (iterator)local_80._M_impl._M_node.super__List_node_base._M_next);
      RegistryEntry::Write((RegistryEntry *)local_68,os);
      Enumerate(&local_a0,local_88,(RegistryEntry *)local_68,0xc0000000,0x800);
      pRVar1 = local_a0.
               super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar4 = local_a0.
                    super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1
          ) {
        RegistryEntry::Write(pRVar4,os);
      }
      std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
                (&local_a0);
      Enumerate(&local_a0,local_88,(RegistryEntry *)local_68,0,0x400);
      pRVar1 = local_a0.
               super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar4 = local_a0.
                    super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1
          ) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)pRVar4,
                   (pRVar4->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,CONCAT71(local_68._1_7_,local_68[0]),
                   local_68._8_8_);
        *(uchar *)(local_68._8_8_ +
                  (long)((pRVar4->buffer).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + ~CONCAT71(local_68._1_7_,local_68[0])))
             = '\\';
        pRVar4->keyLen =
             (size_t)(local_68._8_8_ + (pRVar4->keyLen - CONCAT71(local_68._1_7_,local_68[0])));
        p_Var3 = std::__cxx11::list<bhf::ads::RegistryEntry,std::allocator<bhf::ads::RegistryEntry>>
                 ::_M_create_node<bhf::ads::RegistryEntry_const&>
                           ((list<bhf::ads::RegistryEntry,std::allocator<bhf::ads::RegistryEntry>> *
                            )&local_80,pRVar4);
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
      }
      std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
                (&local_a0);
      if ((void *)CONCAT71(local_68._1_7_,local_68[0]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_68._1_7_,local_68[0]));
      }
    } while (local_80._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_80)
    ;
  }
  std::__cxx11::_List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::
  _M_clear(&local_80);
  local_68[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_68,1);
  return 0;
}

Assistant:

int RegistryAccess::Export(const std::string& firstKey, std::ostream& os) const
{
    os << bhf::ads::WINDOWS_REGISTRY_HEADER << "\n";

    for (std::list<RegistryEntry> pendingKeys { RegistryEntry::Create(firstKey) }; !pendingKeys.empty(); ) {
        auto key = pendingKeys.front();
        pendingKeys.pop_front();
        key.Write(os);

        // First dump all the values of a key
        for (const auto& value: Enumerate(key, REGFLAG_ENUMVALUE_VTD, 0x800)) {
            value.Write(os);
        }

        // Then find all subkey and put them into a queue to omit recursion
        const auto pendingKeysFront = pendingKeys.cbegin();
        for (auto& newKey: Enumerate(key, REGFLAG_ENUMKEYS, 0x400)) {
            newKey.buffer.insert(newKey.buffer.begin(), key.buffer.cbegin(), key.buffer.cend());
            newKey.buffer[key.buffer.size() - 1] = '\\';
            newKey.keyLen += key.buffer.size();
            pendingKeys.insert(pendingKeysFront, newKey);
        }
    }
    os << '\n';
    return 0;
}